

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePath.h
# Opt level: O2

TypePath * __thiscall
Js::TypePath::Branch<true>
          (TypePath *this,Recycler *recycler,int pathLength,bool couldSeeProto,
          ObjectSlotAttributes *attributes)

{
  byte bVar1;
  Data *pDVar2;
  RecyclerWeakReference<Js::DynamicObject> *pRVar3;
  code *pcVar4;
  bool bVar5;
  BOOLEAN BVar6;
  bool bVar7;
  undefined4 *puVar8;
  TypePath *this_00;
  PropertyRecord *pPVar9;
  PropertyIndex i;
  uint uVar10;
  
  if ((int)(uint)((this->data).ptr)->pathLength <= pathLength) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/TypePath.h"
                                ,0xca,"(pathLength < this->GetPathLength())",
                                "Why are we branching at the tip of the type path?");
    if (!bVar5) goto LAB_00c5537b;
    *puVar8 = 0;
  }
  if (attributes == (ObjectSlotAttributes *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/TypePath.h"
                                ,0xcb,"(checkAttributes == (attributes != nullptr))",
                                "checkAttributes == (attributes != nullptr)");
    if (!bVar5) {
LAB_00c5537b:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar8 = 0;
  }
  this_00 = New(recycler,pathLength + 1);
  for (uVar10 = 0; uVar10 = uVar10 & 0xffff, (int)uVar10 < pathLength; uVar10 = uVar10 + 1) {
    pDVar2 = (&this[1].data)[uVar10].ptr;
    if (attributes[uVar10] == ObjectSlotAttr_Setter) {
      AddInternal<false>(this_00,(PropertyRecord *)pDVar2);
    }
    else {
      AddInternal<true>(this_00,(PropertyRecord *)pDVar2);
    }
    if (couldSeeProto) {
      BVar6 = BVStatic<128UL>::Test(&((this->data).ptr)->usedFixedFields,uVar10);
      if (BVar6 == '\0') {
        BVar6 = BVStatic<128UL>::Test(&((this->data).ptr)->fixedFields,uVar10);
        if (BVar6 != '\0') {
          BVStatic<128UL>::Clear(&((this->data).ptr)->fixedFields,uVar10);
        }
      }
      else {
        BVStatic<128UL>::Set(&((this_00->data).ptr)->usedFixedFields,uVar10);
      }
    }
  }
  if ((int)(uint)((this->data).ptr)->maxInitializedLength < pathLength) {
    SetMaxInitializedLength(this,pathLength);
  }
  SetMaxInitializedLength(this_00,pathLength);
  bVar5 = Phases::IsEnabled((Phases *)&DAT_01453738,FixMethodPropsPhase);
  if ((bVar5) && (DAT_0145948a == '\x01')) {
    pRVar3 = (this->singletonInstance).ptr;
    Output::Print(L"FixedFields: TypePath::Branch: singleton: 0x%p(0x%p)\n",pRVar3,
                  (pRVar3->super_RecyclerWeakReferenceBase).strongRef);
    Output::Print(L"   fixed fields:");
    for (uVar10 = 0; uVar10 < ((this->data).ptr)->pathLength; uVar10 = uVar10 + 1) {
      pPVar9 = GetPropertyId(this,uVar10);
      pDVar2 = (this->data).ptr;
      bVar1 = pDVar2->maxInitializedLength;
      bVar5 = GetIsFixedFieldAt(this,(PropertyIndex)uVar10,(uint)pDVar2->pathLength);
      bVar7 = GetIsUsedFixedFieldAt(this,(PropertyIndex)uVar10,(uint)((this->data).ptr)->pathLength)
      ;
      Output::Print(L" %s %d%d%d,",pPVar9 + 1,(ulong)(uVar10 < bVar1),(ulong)bVar5,(ulong)bVar7);
    }
    Output::Print(L"\n");
  }
  return this_00;
}

Assistant:

TypePath * Branch(Recycler * recycler, int pathLength, bool couldSeeProto, ObjectSlotAttributes * attributes = nullptr)
        {
            AssertMsg(pathLength < this->GetPathLength(), "Why are we branching at the tip of the type path?");
            Assert(checkAttributes == (attributes != nullptr));

            // Ensure there is at least one free entry in the new path, so we can extend it.
            // TypePath::New will take care of aligning this appropriately.
            TypePath * branchedPath = TypePath::New(recycler, pathLength + 1);

            for (PropertyIndex i = 0; i < pathLength; i++)
            {
                if (checkAttributes && attributes[i] == ObjectSlotAttr_Setter)
                {
                    branchedPath->AddInternal<false>(assignments[i]);
                }
                else
                {
                    branchedPath->AddInternal<true>(assignments[i]);
                }

#ifdef SUPPORT_FIXED_FIELDS_ON_PATH_TYPES
                if (couldSeeProto)
                {
                    if (this->GetData()->usedFixedFields.Test(i))
                    {
                        // We must conservatively copy all used as fixed bits if some prototype instance could also take
                        // this transition.  See comment in PathTypeHandlerBase::ConvertToSimpleDictionaryType.
                        // Yes, we could devise a more efficient way of copying bits 1 through pathLength, if performance of this
                        // code path proves important enough.
                        branchedPath->GetData()->usedFixedFields.Set(i);
                    }
                    else if (this->GetData()->fixedFields.Test(i))
                    {
                        // We must clear any fixed fields that are not also used as fixed if some prototype instance could also take
                        // this transition.  See comment in PathTypeHandlerBase::ConvertToSimpleDictionaryType.
                        this->GetData()->fixedFields.Clear(i);
                    }
                }
#endif

            }

#ifdef SUPPORT_FIXED_FIELDS_ON_PATH_TYPES
            // When branching, we must ensure that fixed field values on the prefix shared by the two branches are always
            // consistent.  Hence, we can't leave any of them uninitialized, because they could later get initialized to
            // different values, by two different instances (one on the old branch and one on the new branch).  If that happened
            // and the instance from the old branch later switched to the new branch, it would magically gain a different set
            // of fixed properties!
            if (this->GetMaxInitializedLength() < pathLength)
            {
                this->SetMaxInitializedLength(pathLength);
            }
            branchedPath->SetMaxInitializedLength(pathLength);
#endif

#ifdef SUPPORT_FIXED_FIELDS_ON_PATH_TYPES
            if (PHASE_VERBOSE_TRACE1(FixMethodPropsPhase))
            {
                Output::Print(_u("FixedFields: TypePath::Branch: singleton: 0x%p(0x%p)\n"), PointerValue(this->singletonInstance), this->singletonInstance->Get());
                Output::Print(_u("   fixed fields:"));

                for (PropertyIndex i = 0; i < GetPathLength(); i++)
                {
                    Output::Print(_u(" %s %d%d%d,"), GetPropertyId(i)->GetBuffer(),
                        i < GetMaxInitializedLength() ? 1 : 0,
                        GetIsFixedFieldAt(i, GetPathLength()) ? 1 : 0,
                        GetIsUsedFixedFieldAt(i, GetPathLength()) ? 1 : 0);
                }

                Output::Print(_u("\n"));
            }
#endif

            return branchedPath;
        }